

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerSafe::SetCommissionerDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,CommissionerDataset *aDataset)

{
  pointer puVar1;
  _func_void *p_Var2;
  size_t sVar3;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  code *local_c0;
  CommissionerSafe *local_b8;
  CommissionerSafe *local_b0;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined8 local_38;
  
  local_b0 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_a8,aHandler);
  local_88._0_2_ = aDataset->mBorderAgentLocator;
  local_88._2_2_ = aDataset->mSessionId;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_80,&aDataset->mSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,&aDataset->mAeSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50,&aDataset->mNmkpSteeringData);
  local_38._0_2_ = aDataset->mJoinerUdpPort;
  local_38._2_2_ = aDataset->mAeUdpPort;
  local_38._4_2_ = aDataset->mNmkpUdpPort;
  local_38._6_2_ = aDataset->mPresentFlags;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  p_Var2 = (_func_void *)operator_new(0x80);
  *(CommissionerSafe **)p_Var2 = local_b0;
  local_c0 = p_Var2 + 8;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_90;
  if (local_98 != (code *)0x0) {
    *(void **)local_c0 = local_a8._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_a8._8_8_;
    *(code **)(p_Var2 + 0x18) = local_98;
    local_98 = (code *)0x0;
    uStack_90 = 0;
  }
  *(undefined4 *)(p_Var2 + 0x28) = local_88;
  *(undefined8 *)(p_Var2 + 0x30) = 0;
  *(undefined8 *)(p_Var2 + 0x38) = 0;
  *(undefined8 *)(p_Var2 + 0x40) = 0;
  local_b8 = this;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x30),
             (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x30))->
           _M_impl).super__Vector_impl_data._M_start;
  sVar3 = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar3 != 0) {
    memmove(puVar1,local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar3);
  }
  *(pointer *)(p_Var2 + 0x38) = puVar1 + sVar3;
  *(undefined8 *)(p_Var2 + 0x48) = 0;
  *(undefined8 *)(p_Var2 + 0x50) = 0;
  *(undefined8 *)(p_Var2 + 0x58) = 0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x48),
             (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x48))->
           _M_impl).super__Vector_impl_data._M_start;
  sVar3 = (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar3 != 0) {
    memmove(puVar1,local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar3);
  }
  *(pointer *)(p_Var2 + 0x50) = puVar1 + sVar3;
  *(undefined8 *)(p_Var2 + 0x60) = 0;
  *(undefined8 *)(p_Var2 + 0x68) = 0;
  *(undefined8 *)(p_Var2 + 0x70) = 0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x60),
             (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var2 + 0x60))->
           _M_impl).super__Vector_impl_data._M_start;
  sVar3 = (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar3 != 0) {
    memmove(puVar1,local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar3);
  }
  *(pointer *)(p_Var2 + 0x68) = puVar1 + sVar3;
  *(undefined8 *)(p_Var2 + 0x78) = local_38;
  pcStack_d0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:247:22)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:247:22)>
             ::_M_manager;
  local_e8._M_unused._0_8_ = (undefined8)p_Var2;
  PushAsyncRequest(local_b8,(AsyncRequest *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::SetCommissionerDataset(ErrorHandler aHandler, const CommissionerDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetCommissionerDataset(aHandler, aDataset); });
}